

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

bool __thiscall Controller::loadGraphic(Controller *this,QImage *image)

{
  QImage *image_00;
  bool bVar1;
  uint uVar2;
  pointer pIVar3;
  bool local_21;
  unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_> local_20;
  QImage *local_18;
  QImage *image_local;
  Controller *this_local;
  
  local_18 = image;
  image_local = (QImage *)this;
  std::make_unique<ImageProvider>();
  std::unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_>::operator=
            (&this->imageProvider,&local_20);
  std::unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_>::~unique_ptr(&local_20);
  pIVar3 = std::unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_>::operator->
                     (&this->imageProvider);
  image_00 = local_18;
  uVar2 = Options::getTileSize();
  ImageProvider::prepareGraphicBoard(pIVar3,image_00,(ulong)uVar2);
  pIVar3 = std::unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_>::operator->
                     (&this->imageProvider);
  bVar1 = ImageProvider::isGraphicBoard(pIVar3,FOUR);
  local_21 = true;
  if (!bVar1) {
    pIVar3 = std::unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_>::operator->
                       (&this->imageProvider);
    bVar1 = ImageProvider::isGraphicBoard(pIVar3,FIVE);
    local_21 = true;
    if (!bVar1) {
      pIVar3 = std::unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_>::operator->
                         (&this->imageProvider);
      bVar1 = ImageProvider::isGraphicBoard(pIVar3,SIX);
      local_21 = true;
      if (!bVar1) {
        pIVar3 = std::unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_>::operator->
                           (&this->imageProvider);
        local_21 = ImageProvider::isGraphicBoard(pIVar3,SEVEN);
      }
    }
  }
  return local_21;
}

Assistant:

bool Controller::loadGraphic( QImage& image )
{
    imageProvider = std::make_unique<ImageProvider>();
    imageProvider->prepareGraphicBoard( image, Options::getTileSize() );

    return imageProvider->isGraphicBoard( BoardSize::FOUR ) || imageProvider->isGraphicBoard( BoardSize::FIVE ) ||
           imageProvider->isGraphicBoard( BoardSize::SIX )  || imageProvider->isGraphicBoard( BoardSize::SEVEN );
}